

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.cc
# Opt level: O1

Symbol * __thiscall
sentencepiece::bpe::Trainer::GetPairSymbol(Trainer *this,Symbol *left,Symbol *right)

{
  pointer *pppSVar1;
  pointer puVar2;
  iterator __position;
  Trainer *pTVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  ostream *poVar8;
  _Rb_tree_header *p_Var9;
  ulong uVar10;
  Symbol *pSVar11;
  pointer puVar12;
  ulong uVar13;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  _Hash_node_base *p_Var16;
  Symbol *s;
  UnicodeText ut;
  Symbol *local_60;
  UnicodeText local_58;
  Trainer *local_38;
  
  if (((right == (Symbol *)0x0 || left == (Symbol *)0x0) || (left->is_unk != false)) ||
     (right->is_unk != false)) {
    pSVar11 = (Symbol *)0x0;
  }
  else {
    uVar6 = right->fp;
    uVar5 = uVar6 >> 0x2b ^ (left->fp - uVar6) + 0x1f73e299748a907e;
    uVar10 = uVar5 << 9 ^ (-0x1f73e299748a907e - uVar6) - uVar5;
    uVar13 = uVar10 >> 8 ^ (uVar6 - uVar5) - uVar10;
    uVar5 = uVar13 >> 0x26 ^ (uVar5 - uVar10) - uVar13;
    uVar6 = uVar5 << 0x17 ^ (uVar10 - uVar13) - uVar5;
    uVar10 = uVar6 >> 5 ^ (uVar13 - uVar5) - uVar6;
    uVar13 = uVar10 >> 0x23 ^ (uVar5 - uVar6) - uVar10;
    uVar5 = uVar13 << 0x31 ^ (uVar6 - uVar10) - uVar13;
    uVar6 = uVar5 >> 0xb ^ (uVar10 - uVar13) - uVar5;
    uVar10 = uVar6 >> 0xc ^ (uVar13 - uVar5) - uVar6;
    uVar5 = uVar10 << 0x12 ^ (uVar5 - uVar6) - uVar10;
    p_Var16 = (_Hash_node_base *)(uVar5 >> 0x16 ^ uVar6 - (uVar10 + uVar5));
    uVar6 = (this->symbols_cache_)._M_h._M_bucket_count;
    uVar5 = (ulong)p_Var16 % uVar6;
    p_Var14 = (this->symbols_cache_)._M_h._M_buckets[uVar5];
    p_Var15 = (__node_base_ptr)0x0;
    if ((p_Var14 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var14->_M_nxt, p_Var15 = p_Var14, p_Var16 != p_Var14->_M_nxt[1]._M_nxt)) {
      while (p_Var14 = p_Var7, p_Var7 = p_Var14->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
        p_Var15 = (__node_base_ptr)0x0;
        if (((ulong)p_Var7[1]._M_nxt % uVar6 != uVar5) ||
           (p_Var15 = p_Var14, p_Var16 == p_Var7[1]._M_nxt)) goto LAB_0016ede8;
      }
      p_Var15 = (__node_base_ptr)0x0;
    }
LAB_0016ede8:
    if (p_Var15 == (__node_base_ptr)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var15->_M_nxt;
    }
    if (p_Var7 == (_Hash_node_base *)0x0) {
      if ((left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_58.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bpe_model_trainer.cc",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x40);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!left->chars.empty()",0x14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
        error::Die::~Die((Die *)&local_58);
      }
      if ((right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_58.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bpe_model_trainer.cc",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x41);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!right->chars.empty()",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
        error::Die::~Die((Die *)&local_58);
      }
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      puVar12 = (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
      local_38 = this;
      if (puVar12 != puVar2) {
        do {
          local_60 = (Symbol *)CONCAT44(local_60._4_4_,*puVar12);
          if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                       (iterator)
                       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_60);
          }
          else {
            *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *puVar12;
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar2);
      }
      puVar12 = (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar12 != puVar2) {
        do {
          local_60 = (Symbol *)CONCAT44(local_60._4_4_,*puVar12);
          if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                       (iterator)
                       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_60);
          }
          else {
            *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *puVar12;
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar2);
      }
      pTVar3 = local_38;
      bVar4 = TrainerInterface::IsValidSentencePiece(&local_38->super_TrainerInterface,&local_58);
      if (bVar4) {
        local_60 = (Symbol *)operator_new(0x70);
        p_Var9 = &(local_60->positions)._M_t._M_impl.super__Rb_tree_header;
        (local_60->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_60->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_60->left = (Symbol *)0x0;
        local_60->right = (Symbol *)0x0;
        (local_60->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_60->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_60->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_60->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        local_60->fp = 0;
        local_60->freq = 0;
        (local_60->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var9->_M_header;
        (local_60->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var9->_M_header;
        (local_60->positions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __position._M_current =
             (pTVar3->allocated_).
             super__Vector_base<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pTVar3->allocated_).
            super__Vector_base<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<sentencepiece::bpe::Trainer::Symbol*,std::allocator<sentencepiece::bpe::Trainer::Symbol*>>
          ::_M_realloc_insert<sentencepiece::bpe::Trainer::Symbol*const&>
                    ((vector<sentencepiece::bpe::Trainer::Symbol*,std::allocator<sentencepiece::bpe::Trainer::Symbol*>>
                      *)&pTVar3->allocated_,__position,&local_60);
        }
        else {
          *__position._M_current = local_60;
          pppSVar1 = &(pTVar3->allocated_).
                      super__Vector_base<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
        local_60->fp = (uint64_t)p_Var16;
        local_60->left = left;
        local_60->right = right;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&local_60->chars,&local_58);
        port::
        InsertOrDie<std::unordered_map<unsigned_long,sentencepiece::bpe::Trainer::Symbol*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,sentencepiece::bpe::Trainer::Symbol*>>>>
                  (&pTVar3->symbols_cache_,&local_60->fp,&local_60);
        pSVar11 = local_60;
      }
      else {
        pSVar11 = (Symbol *)0x0;
      }
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      pSVar11 = (Symbol *)p_Var7[2]._M_nxt;
    }
  }
  return pSVar11;
}

Assistant:

Trainer::Symbol *Trainer::GetPairSymbol(const Symbol *left,
                                        const Symbol *right) {
  if (left == nullptr || right == nullptr || left->is_unk || right->is_unk) {
    return nullptr;
  }

  const uint64 fp = port::FingerprintCat(left->fp, right->fp);
  const auto it = symbols_cache_.find(fp);
  if (it != symbols_cache_.end()) {
    return it->second;
  }

  CHECK(!left->chars.empty());
  CHECK(!right->chars.empty());
  string_util::UnicodeText ut;
  for (const char32 c : left->chars) ut.push_back(c);
  for (const char32 c : right->chars) ut.push_back(c);

  // Do not make an invalid piece.
  if (!IsValidSentencePiece(ut)) {
    return nullptr;
  }

  Symbol *s = new Symbol;
  allocated_.push_back(s);
  s->fp = fp;
  s->left = left;
  s->right = right;
  s->chars = ut;
  port::InsertOrDie(&symbols_cache_, s->fp, s);
  return s;
}